

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::param::Chart::Chart
          (Chart *this,ChartCtorBuffers *buffers,Chart *parent,Mesh *parentMesh,
          ConstArrayView<unsigned_int> faces,Vector2 *texcoords,Mesh *originalMesh,uint32_t meshId,
          uint32_t chartGroupId,uint32_t chartId)

{
  Mesh **ppMVar1;
  Array<xatlas::internal::Vector3> *this_00;
  uint32_t *puVar2;
  uint uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Enum EVar7;
  uint *puVar8;
  Mesh *pMVar9;
  uint *puVar10;
  Vector3 *pVVar11;
  Vector3 *v1;
  Array<unsigned_int> *pAVar12;
  char *pcVar13;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar14;
  undefined8 extraout_RDX_00;
  long lVar15;
  Array<unsigned_int> *this_01;
  uint32_t newSize;
  uint32_t i_1;
  int iVar16;
  long lVar17;
  uint32_t i;
  uint32_t uVar18;
  uint32_t vertex;
  uint32_t indices [3];
  ConstArrayView<unsigned_int> faces_local;
  
  puVar10 = faces.data;
  newSize = faces.length;
  (this->m_basis).bitangent.y = 0.0;
  (this->m_basis).bitangent.z = 0.0;
  (this->m_basis).normal.x = 0.0;
  (this->m_basis).normal.y = 0.0;
  (this->m_basis).tangent.x = 0.0;
  (this->m_basis).tangent.y = 0.0;
  *(undefined8 *)&(this->m_basis).tangent.z = 0;
  (this->m_basis).normal.z = 0.0;
  this->m_mesh = (Mesh *)0x0;
  this->m_unifiedMesh = (Mesh *)0x0;
  this->m_unmodifiedUnifiedMesh = (Mesh *)0x0;
  this->m_type = Piecewise;
  this->m_warningFlags = 0;
  this->m_closedHolesCount = 0;
  this->m_fixedTJunctionsCount = 0;
  (this->m_faceArray).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceArray).m_base.elementSize = 4;
  (this->m_faceArray).m_base.size = 0;
  (this->m_faceArray).m_base.capacity = 0;
  this_01 = &this->m_faceArray;
  (this->m_chartToOriginalMap).m_base.buffer = (uint8_t *)0x0;
  (this->m_chartToOriginalMap).m_base.elementSize = 4;
  (this->m_chartToOriginalMap).m_base.size = 0;
  (this->m_chartToOriginalMap).m_base.capacity = 0;
  (this->m_chartToUnifiedMap).m_base.buffer = (uint8_t *)0x0;
  (this->m_chartToUnifiedMap).m_base.elementSize = 4;
  (this->m_chartToUnifiedMap).m_base.size = 0;
  (this->m_chartToUnifiedMap).m_base.capacity = 0;
  (this->m_quality).boundaryIntersection = false;
  (this->m_quality).totalTriangleCount = 0;
  (this->m_quality).flippedTriangleCount = 0;
  (this->m_quality).zeroAreaTriangleCount = 0;
  (this->m_quality).totalParametricArea = 0.0;
  (this->m_quality).totalGeometricArea = 0.0;
  (this->m_quality).stretchMetric = 0.0;
  (this->m_quality).maxStretchMetric = 0.0;
  (this->m_quality).conformalMetric = 0.0;
  (this->m_quality).authalicMetric = 0.0;
  this->m_initialFaceCount = newSize;
  pAVar12 = &this->m_chartToOriginalMap;
  faces_local.data = puVar10;
  faces_local.length = newSize;
  Array<unsigned_int>::resize(this_01,newSize);
  ppMVar1 = &this->m_mesh;
  uVar14 = extraout_RDX;
  for (uVar18 = 0; newSize != uVar18; uVar18 = uVar18 + 1) {
    puVar8 = ConstArrayView<unsigned_int>::operator[](&faces_local,uVar18);
    puVar8 = Array<unsigned_int>::operator[](&parent->m_faceArray,*puVar8);
    uVar3 = *puVar8;
    puVar8 = Array<unsigned_int>::operator[](this_01,uVar18);
    *puVar8 = uVar3;
    uVar14 = extraout_RDX_00;
  }
  pMVar9 = (Mesh *)Realloc((void *)0x0,0x1c0,(int)uVar14,(char *)pAVar12,(int)puVar10);
  uVar18 = (this->m_faceArray).m_base.size;
  pcVar13 = (char *)0x0;
  iVar16 = -1;
  Mesh::Mesh(pMVar9,originalMesh->m_epsilon,uVar18 * 3,uVar18,0,0xffffffff);
  *ppMVar1 = pMVar9;
  pMVar9 = (Mesh *)Realloc((void *)0x0,0x1c0,extraout_EDX,pcVar13,iVar16);
  uVar18 = (this->m_faceArray).m_base.size;
  Mesh::Mesh(pMVar9,originalMesh->m_epsilon,uVar18 * 3,uVar18,0,0xffffffff);
  this->m_unifiedMesh = pMVar9;
  Array<unsigned_int>::resize(&buffers->chartMeshIndices,(originalMesh->m_positions).m_base.size);
  indices[0] = 0xffffffff;
  Array<unsigned_int>::setAll(&buffers->chartMeshIndices,indices);
  pAVar12 = &buffers->unifiedMeshIndices;
  Array<unsigned_int>::resize(pAVar12,(originalMesh->m_positions).m_base.size);
  indices[0] = 0xffffffff;
  Array<unsigned_int>::setAll(pAVar12,indices);
  this_00 = &originalMesh->m_positions;
  for (uVar18 = 0; uVar18 != newSize; uVar18 = uVar18 + 1) {
    for (iVar16 = 0; iVar16 != 3; iVar16 = iVar16 + 1) {
      puVar10 = Array<unsigned_int>::operator[](this_01,uVar18);
      vertex = Mesh::vertexAt(originalMesh,*puVar10 * 3 + iVar16);
      uVar5 = Mesh::firstColocal(originalMesh,vertex);
      puVar10 = ConstArrayView<unsigned_int>::operator[](&faces_local,uVar18);
      uVar6 = Mesh::vertexAt(parentMesh,*puVar10 * 3 + iVar16);
      puVar10 = Array<unsigned_int>::operator[](pAVar12,uVar5);
      if (*puVar10 == 0xffffffff) {
        uVar3 = (this->m_unifiedMesh->m_positions).m_base.size;
        puVar10 = Array<unsigned_int>::operator[](pAVar12,uVar5);
        *puVar10 = uVar3;
        pVVar11 = Array<xatlas::internal::Vector3>::operator[](this_00,vertex);
        v1 = Array<xatlas::internal::Vector3>::operator[](this_00,uVar5);
        bVar4 = equal(pVVar11,v1,originalMesh->m_epsilon);
        if (!bVar4) {
          __assert_fail("equal(originalMesh->position(vertex), originalMesh->position(unifiedVertex), originalMesh->epsilon())"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1a8b,
                        "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                       );
        }
        pMVar9 = this->m_unifiedMesh;
        pVVar11 = Array<xatlas::internal::Vector3>::operator[](this_00,vertex);
        indices[0] = 0;
        indices[1] = 0;
        indices[2] = 0;
        Mesh::addVertex(pMVar9,pVVar11,(Vector3 *)indices,texcoords + uVar6);
      }
      puVar10 = Array<unsigned_int>::operator[](&buffers->chartMeshIndices,vertex);
      if (*puVar10 == 0xffffffff) {
        uVar3 = ((*ppMVar1)->m_positions).m_base.size;
        puVar10 = Array<unsigned_int>::operator[](&buffers->chartMeshIndices,vertex);
        *puVar10 = uVar3;
        ArrayBase::push_back(&(this->m_chartToOriginalMap).m_base,(uint8_t *)&vertex);
        puVar10 = Array<unsigned_int>::operator[](pAVar12,uVar5);
        ArrayBase::push_back(&(this->m_chartToUnifiedMap).m_base,(uint8_t *)puVar10);
        pMVar9 = *ppMVar1;
        pVVar11 = Array<xatlas::internal::Vector3>::operator[](this_00,vertex);
        indices[0] = 0;
        indices[1] = 0;
        indices[2] = 0;
        Mesh::addVertex(pMVar9,pVVar11,(Vector3 *)indices,texcoords + uVar6);
      }
    }
  }
  uVar18 = 0;
  while( true ) {
    if (uVar18 == newSize) {
      Mesh::createBoundaries(*ppMVar1);
      Mesh::createBoundaries(this->m_unifiedMesh);
      Mesh::linkBoundaries(this->m_unifiedMesh);
      return;
    }
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      puVar10 = Array<unsigned_int>::operator[](this_01,uVar18);
      uVar5 = Mesh::vertexAt(originalMesh,*puVar10 * 3 + (int)lVar17);
      puVar10 = Array<unsigned_int>::operator[](&buffers->chartMeshIndices,uVar5);
      indices[lVar17] = *puVar10;
      uVar5 = Mesh::firstColocal(originalMesh,uVar5);
      puVar10 = Array<unsigned_int>::operator[](pAVar12,uVar5);
      (&vertex)[lVar17] = *puVar10;
    }
    EVar7 = Mesh::addFace(*ppMVar1,indices,false,true);
    if (EVar7 != OK) break;
    lVar17 = 0;
    while (lVar17 != 3) {
      lVar15 = 0;
      if (lVar17 != 2) {
        lVar15 = lVar17 + 1;
      }
      puVar2 = &vertex + lVar17;
      lVar17 = lVar17 + 1;
      if (*puVar2 == (&vertex)[lVar15]) {
        __assert_fail("index1 != index2",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x1aa6,
                      "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                     );
      }
    }
    EVar7 = Mesh::addFace(this->m_unifiedMesh,&vertex,false,true);
    if (EVar7 != OK) {
      __assert_fail("result == Mesh::AddFaceResult::OK",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x1aab,
                    "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    uVar18 = uVar18 + 1;
  }
  __assert_fail("result == Mesh::AddFaceResult::OK",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x1aa0,
                "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

Chart(ChartCtorBuffers &buffers, const Chart *parent, const Mesh *parentMesh, ConstArrayView<uint32_t> faces, const Vector2 *texcoords, const Mesh *originalMesh, uint32_t meshId, uint32_t chartGroupId, uint32_t chartId) : m_mesh(nullptr), m_unifiedMesh(nullptr), m_unmodifiedUnifiedMesh(nullptr), m_type(ChartType::Piecewise), m_warningFlags(0), m_closedHolesCount(0), m_fixedTJunctionsCount(0)
	{
		XA_UNUSED(meshId);
		XA_UNUSED(chartGroupId);
		XA_UNUSED(chartId);
		const uint32_t faceCount = m_initialFaceCount = faces.length;
		m_faceArray.resize(faceCount);
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceArray[i] = parent->m_faceArray[faces[i]]; // Map faces to parent chart original mesh.
		// Copy face indices.
		m_mesh = XA_NEW_ARGS(MemTag::Mesh, Mesh, originalMesh->epsilon(), m_faceArray.size() * 3, m_faceArray.size());
		m_unifiedMesh = XA_NEW_ARGS(MemTag::Mesh, Mesh, originalMesh->epsilon(), m_faceArray.size() * 3, m_faceArray.size());
		Array<uint32_t> &chartMeshIndices = buffers.chartMeshIndices;
		chartMeshIndices.resize(originalMesh->vertexCount());
		chartMeshIndices.setAll(UINT32_MAX);
		Array<uint32_t> &unifiedMeshIndices = buffers.unifiedMeshIndices;
		unifiedMeshIndices.resize(originalMesh->vertexCount());
		unifiedMeshIndices.setAll(UINT32_MAX);
		// Add vertices.
		for (uint32_t f = 0; f < faceCount; f++) {
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = originalMesh->vertexAt(m_faceArray[f] * 3 + i);
				const uint32_t unifiedVertex = originalMesh->firstColocal(vertex);
				const uint32_t parentVertex = parentMesh->vertexAt(faces[f] * 3 + i);
				if (unifiedMeshIndices[unifiedVertex] == (uint32_t)~0) {
					unifiedMeshIndices[unifiedVertex] = m_unifiedMesh->vertexCount();
					XA_DEBUG_ASSERT(equal(originalMesh->position(vertex), originalMesh->position(unifiedVertex), originalMesh->epsilon()));
					m_unifiedMesh->addVertex(originalMesh->position(vertex), Vector3(0.0f), texcoords[parentVertex]);
				}
				if (chartMeshIndices[vertex] == (uint32_t)~0) {
					chartMeshIndices[vertex] = m_mesh->vertexCount();
					m_chartToOriginalMap.push_back(vertex);
					m_chartToUnifiedMap.push_back(unifiedMeshIndices[unifiedVertex]);
					m_mesh->addVertex(originalMesh->position(vertex), Vector3(0.0f), texcoords[parentVertex]);
				}
			}
		}
		// Add faces.
		for (uint32_t f = 0; f < faceCount; f++) {
			uint32_t indices[3], unifiedIndices[3];
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = originalMesh->vertexAt(m_faceArray[f] * 3 + i);
				indices[i] = chartMeshIndices[vertex];
				unifiedIndices[i] = unifiedMeshIndices[originalMesh->firstColocal(vertex)];
			}
			Mesh::AddFaceResult::Enum result = m_mesh->addFace(indices);
			XA_UNUSED(result);
			XA_DEBUG_ASSERT(result == Mesh::AddFaceResult::OK);
#if XA_DEBUG
			// Unifying colocals may create degenerate edges. e.g. if two triangle vertices are colocal.
			for (int i = 0; i < 3; i++) {
				const uint32_t index1 = unifiedIndices[i];
				const uint32_t index2 = unifiedIndices[(i + 1) % 3];
				XA_DEBUG_ASSERT(index1 != index2);
			}
#endif
			result = m_unifiedMesh->addFace(unifiedIndices);
			XA_UNUSED(result);
			XA_DEBUG_ASSERT(result == Mesh::AddFaceResult::OK);
		}
		m_mesh->createBoundaries(); // For AtlasPacker::computeBoundingBox
		m_unifiedMesh->createBoundaries();
		m_unifiedMesh->linkBoundaries();
	}